

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umsg.cpp
# Opt level: O3

UMessageFormat *
umsg_open_63(UChar *pattern,int32_t patternLength,char *locale,UParseError *parseError,
            UErrorCode *status)

{
  int32_t textLength;
  UErrorCode UVar1;
  MessageFormat *this;
  size_t size;
  UParseError *parseError_00;
  UnicodeString patString;
  UParseError tErr;
  ConstChar16Ptr local_1a8;
  UChar *local_1a0;
  UnicodeString local_190;
  Locale local_150;
  UParseError local_70;
  
  if ((status == (UErrorCode *)0x0) || (U_ZERO_ERROR < *status)) {
    return (UMessageFormat *)0x0;
  }
  if (pattern == (UChar *)0x0 || patternLength < -1) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return (UMessageFormat *)0x0;
  }
  parseError_00 = &local_70;
  if (parseError != (UParseError *)0x0) {
    parseError_00 = parseError;
  }
  textLength = patternLength;
  if (patternLength == -1) {
    textLength = u_strlen_63(pattern);
  }
  size = (size_t)(patternLength == -1);
  local_1a8.p_ = pattern;
  icu_63::UnicodeString::UnicodeString(&local_190,patternLength == -1,&local_1a8,textLength);
  local_1a0 = local_1a8.p_;
  this = (MessageFormat *)icu_63::UMemory::operator_new((UMemory *)0x330,size);
  if (this == (MessageFormat *)0x0) {
    UVar1 = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    icu_63::Locale::Locale(&local_150,locale,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::MessageFormat::MessageFormat(this,&local_190,&local_150,parseError_00,status);
    icu_63::Locale::~Locale(&local_150);
    if ((U_ZERO_ERROR < *status) ||
       (UVar1 = U_ARGUMENT_TYPE_MISMATCH, this->hasArgTypeConflicts == '\0')) goto LAB_002c9158;
  }
  *status = UVar1;
LAB_002c9158:
  icu_63::UnicodeString::~UnicodeString(&local_190);
  return (UMessageFormat *)this;
}

Assistant:

U_CAPI UMessageFormat* U_EXPORT2
umsg_open(  const UChar     *pattern,
            int32_t         patternLength,
            const  char     *locale,
            UParseError     *parseError,
            UErrorCode      *status)
{
    //check arguments
    if(status==NULL || U_FAILURE(*status))
    {
      return 0;
    }
    if(pattern==NULL||patternLength<-1){
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    UParseError tErr;
    if(parseError==NULL)
    {
        parseError = &tErr;
    }

    int32_t len = (patternLength == -1 ? u_strlen(pattern) : patternLength);
    UnicodeString patString(patternLength == -1, pattern, len);

    MessageFormat* retVal = new MessageFormat(patString,Locale(locale),*parseError,*status);
    if(retVal == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    if (U_SUCCESS(*status) && MessageFormatAdapter::hasArgTypeConflicts(*retVal)) {
        *status = U_ARGUMENT_TYPE_MISMATCH;
    }
    return (UMessageFormat*)retVal;
}